

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::addInstruction
          (Builder *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  _Head_base<0UL,_spv::Instruction_*,_false> _Var1;
  bool bVar2;
  Id IVar3;
  _Elt_pointer puVar4;
  Instruction *pIVar5;
  Block *this_00;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst_00;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  uint local_54 [2];
  Op local_4c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  
  pIVar5 = (inst->_M_t).
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  if (pIVar5->opCode == OpPhi) {
    this_00 = this->buildPoint;
    inst_00 = &local_28;
  }
  else {
    if ((this->emitNonSemanticShaderDebugInfo == true) && (this->dirtyScopeTracker == true)) {
      puVar4 = (this->currentDebugScopeId).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar4 == (this->currentDebugScopeId).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar4 = (this->currentDebugScopeId).c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      bVar2 = Block::updateDebugScope(this->buildPoint,puVar4[-1]);
      if (bVar2) {
        local_54[0] = this->uniqueId + 1;
        this->uniqueId = local_54[0];
        local_4c = makeVoidType(this);
        local_54[1] = 0xc;
        std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
                  ((uint *)&local_60,local_54,&local_4c);
        Instruction::reserveOperands(local_60._M_head_impl,3);
        Instruction::addIdOperand(local_60._M_head_impl,this->nonSemanticShaderDebugInfo);
        Instruction::addImmediateOperand(local_60._M_head_impl,0x17);
        puVar4 = (this->currentDebugScopeId).c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (puVar4 == (this->currentDebugScopeId).c.
                      super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first) {
          puVar4 = (this->currentDebugScopeId).c.
                   super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        Instruction::addIdOperand(local_60._M_head_impl,puVar4[-1]);
        local_38._M_head_impl = local_60._M_head_impl;
        local_60._M_head_impl = (Instruction *)0x0;
        Block::addInstruction
                  (this->buildPoint,
                   (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38
                  );
        if (local_38._M_head_impl != (Instruction *)0x0) {
          (*(local_38._M_head_impl)->_vptr_Instruction[1])();
        }
        local_38._M_head_impl = (Instruction *)0x0;
        if (local_60._M_head_impl != (Instruction *)0x0) {
          (*(local_60._M_head_impl)->_vptr_Instruction[1])();
        }
      }
      this->dirtyScopeTracker = false;
    }
    if ((this->trackDebugInfo == true) && (this->dirtyLineTracker == true)) {
      bVar2 = Block::updateDebugSourceLocation
                        (this->buildPoint,this->currentLine,0,this->currentFileId);
      if (bVar2) {
        if (this->emitSpirvDebugInfo == true) {
          local_54[0] = 8;
          std::make_unique<spv::Instruction,spv::Op>((Op *)&local_60);
          Instruction::reserveOperands(local_60._M_head_impl,3);
          Instruction::addIdOperand(local_60._M_head_impl,this->currentFileId);
          Instruction::addImmediateOperand(local_60._M_head_impl,this->currentLine);
          Instruction::addImmediateOperand(local_60._M_head_impl,0);
          local_40._M_head_impl = local_60._M_head_impl;
          local_60._M_head_impl = (Instruction *)0x0;
          Block::addInstruction
                    (this->buildPoint,
                     (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_40);
          if (local_40._M_head_impl != (Instruction *)0x0) {
            (*(local_40._M_head_impl)->_vptr_Instruction[1])();
          }
          local_40._M_head_impl = (Instruction *)0x0;
          if (local_60._M_head_impl != (Instruction *)0x0) {
            (*(local_60._M_head_impl)->_vptr_Instruction[1])();
          }
        }
        if (this->emitNonSemanticShaderDebugInfo == true) {
          local_54[0] = this->uniqueId + 1;
          this->uniqueId = local_54[0];
          local_4c = makeVoidType(this);
          local_54[1] = 0xc;
          std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
                    ((uint *)&local_60,local_54,&local_4c);
          Instruction::reserveOperands(local_60._M_head_impl,7);
          Instruction::addIdOperand(local_60._M_head_impl,this->nonSemanticShaderDebugInfo);
          Instruction::addImmediateOperand(local_60._M_head_impl,0x67);
          _Var1._M_head_impl = local_60._M_head_impl;
          IVar3 = makeDebugSource(this,this->currentFileId);
          Instruction::addIdOperand(_Var1._M_head_impl,IVar3);
          _Var1._M_head_impl = local_60._M_head_impl;
          IVar3 = makeUintConstant(this,this->currentLine,false);
          Instruction::addIdOperand(_Var1._M_head_impl,IVar3);
          _Var1._M_head_impl = local_60._M_head_impl;
          IVar3 = makeUintConstant(this,this->currentLine,false);
          Instruction::addIdOperand(_Var1._M_head_impl,IVar3);
          _Var1._M_head_impl = local_60._M_head_impl;
          IVar3 = makeUintConstant(this,0,false);
          Instruction::addIdOperand(_Var1._M_head_impl,IVar3);
          _Var1._M_head_impl = local_60._M_head_impl;
          IVar3 = makeUintConstant(this,0,false);
          Instruction::addIdOperand(_Var1._M_head_impl,IVar3);
          local_48._M_head_impl = local_60._M_head_impl;
          local_60._M_head_impl = (Instruction *)0x0;
          Block::addInstruction
                    (this->buildPoint,
                     (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_48);
          if (local_48._M_head_impl != (Instruction *)0x0) {
            (*(local_48._M_head_impl)->_vptr_Instruction[1])();
          }
          local_48._M_head_impl = (Instruction *)0x0;
          if (local_60._M_head_impl != (Instruction *)0x0) {
            (*(local_60._M_head_impl)->_vptr_Instruction[1])();
          }
        }
      }
      this->dirtyLineTracker = false;
    }
    this_00 = this->buildPoint;
    pIVar5 = (inst->_M_t).
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    inst_00 = &local_30;
  }
  (inst_00->_M_t).super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = pIVar5;
  (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  Block::addInstruction
            (this_00,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)inst_00
            );
  pIVar5 = (inst_00->_M_t).
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  if (pIVar5 != (Instruction *)0x0) {
    (*pIVar5->_vptr_Instruction[1])();
  }
  return;
}

Assistant:

void Builder::addInstruction(std::unique_ptr<Instruction> inst) {
    // Phis must appear first in their block, don't insert line tracking instructions
    // in front of them, just add the OpPhi and return.
    if (inst->getOpCode() == OpPhi) {
        buildPoint->addInstruction(std::move(inst));
        return;
    }
    // Optionally insert OpDebugScope
    if (emitNonSemanticShaderDebugInfo && dirtyScopeTracker) {
        if (buildPoint->updateDebugScope(currentDebugScopeId.top())) {
            auto scopeInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
            scopeInst->reserveOperands(3);
            scopeInst->addIdOperand(nonSemanticShaderDebugInfo);
            scopeInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugScope);
            scopeInst->addIdOperand(currentDebugScopeId.top());
            buildPoint->addInstruction(std::move(scopeInst));
        }

        dirtyScopeTracker = false;
    }

    // Insert OpLine/OpDebugLine if the debug source location has changed
    if (trackDebugInfo && dirtyLineTracker) {
        if (buildPoint->updateDebugSourceLocation(currentLine, 0, currentFileId)) {
            if (emitSpirvDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(OpLine);
                lineInst->reserveOperands(3);
                lineInst->addIdOperand(currentFileId);
                lineInst->addImmediateOperand(currentLine);
                lineInst->addImmediateOperand(0);
                buildPoint->addInstruction(std::move(lineInst));
            }
            if (emitNonSemanticShaderDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
                lineInst->reserveOperands(7);
                lineInst->addIdOperand(nonSemanticShaderDebugInfo);
                lineInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugLine);
                lineInst->addIdOperand(makeDebugSource(currentFileId));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(0));
                lineInst->addIdOperand(makeUintConstant(0));
                buildPoint->addInstruction(std::move(lineInst));
            }
        }

        dirtyLineTracker = false;
    }

    buildPoint->addInstruction(std::move(inst));
}